

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O2

void __thiscall
BezierCurve::Define(BezierCurve *this,positionTy *_start,positionTy *_mid,positionTy *_end)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ptTy pVar3;
  long lVar4;
  long lVar5;
  BezierCurve *pBVar6;
  positionTy *ppVar7;
  
  lVar5 = 9;
  pBVar6 = this;
  for (lVar4 = lVar5; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pBVar6->start)._lat = _start->_lat;
    _start = (positionTy *)&_start->_lon;
    pBVar6 = (BezierCurve *)&(pBVar6->start)._lon;
  }
  uVar1 = _mid->_lat;
  uVar2 = _mid->_lon;
  pVar3.y._0_4_ = (int)uVar1;
  pVar3.x = (double)uVar2;
  pVar3.y._4_4_ = (int)((ulong)uVar1 >> 0x20);
  this->ptCtrl = pVar3;
  ppVar7 = &this->end;
  for (; lVar5 != 0; lVar5 = lVar5 + -1) {
    ppVar7->_lat = _end->_lat;
    _end = (positionTy *)&_end->_lon;
    ppVar7 = (positionTy *)&ppVar7->_lon;
  }
  ConvertToMeter(this);
  return;
}

Assistant:

void BezierCurve::Define (const positionTy& _start,
                          const positionTy& _mid,
                          const positionTy& _end)
{
    // init
    start   = _start;
    ptCtrl  = _mid;
    end     = _end;
    
#ifdef DEBUG
    if (gSelAcCalc)
        LOG_MSG(logDEBUG, "Quadratic Bezier defined:\n%s",
                dbgTxt().c_str());
#endif

    // Convert all coordinates to meter
    ConvertToMeter();
}